

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_coded_block_pattern(bitstream *str,int chroma_format,uint32_t *cbp)

{
  uint uVar1;
  int iVar2;
  uint size;
  int iVar3;
  uint *in_RDX;
  int in_ESI;
  int *in_RDI;
  uint32_t tmp;
  uint32_t val;
  int i;
  int cbphs;
  uint32_t cbplo;
  vs_vlc_val *in_stack_00000068;
  uint32_t *in_stack_00000070;
  bitstream *in_stack_00000078;
  int iVar4;
  uint uVar5;
  int local_4;
  
  uVar1 = *in_RDX & 0x3f;
  if (in_ESI == 1) {
    iVar4 = 0;
  }
  else if (in_ESI == 2) {
    iVar4 = 2;
  }
  else {
    if (in_ESI != 3) {
      fprintf(_stderr,"Invalid chroma format\n");
      return 1;
    }
    iVar4 = 6;
  }
  iVar2 = vs_vlc(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  if (iVar2 == 0) {
    uVar5 = uVar1;
    for (iVar2 = 0; iVar2 < iVar4; iVar2 = iVar2 + 1) {
      size = *in_RDX >> ((byte)iVar2 & 0x1f) & 1;
      iVar3 = vs_u((bitstream *)CONCAT44(uVar5,iVar4),(uint32_t *)CONCAT44(iVar2,uVar1),size);
      if (iVar3 != 0) {
        return 1;
      }
      uVar1 = size << ((byte)iVar2 & 0x1f) | uVar1;
    }
    if (*in_RDI == 1) {
      *in_RDX = uVar1;
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int h262_coded_block_pattern(struct bitstream *str, int chroma_format, uint32_t *cbp) {
	uint32_t cbplo = *cbp & 0x3f;
	int cbphs;
	int i;
	uint32_t val;
	switch (chroma_format) {
		case 1:
			cbphs = 0;
			break;
		case 2:
			cbphs = 2;
			break;
		case 3:
			cbphs = 6;
			break;
		default:
			fprintf(stderr, "Invalid chroma format\n");
			return 1;
	}
	if (vs_vlc(str, &cbplo, cbp_vlc)) return 1;
	val = cbplo;
	for (i = 0; i < cbphs; i++) {
		uint32_t tmp = *cbp >> i & 1;
		if (vs_u(str, &tmp, 1)) return 1;
		val |= tmp << i;
	}	
	if (str->dir == VS_DECODE)
		*cbp = val;
	return 0;
}